

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O0

int mbedtls_ssl_ciphersuite_uses_ec(mbedtls_ssl_ciphersuite_t *info)

{
  mbedtls_ssl_ciphersuite_t *info_local;
  
  if ((info->key_exchange - MBEDTLS_KEY_EXCHANGE_ECDHE_RSA < 2) ||
     (info->key_exchange - MBEDTLS_KEY_EXCHANGE_ECDHE_PSK < 3)) {
    info_local._4_4_ = 1;
  }
  else {
    info_local._4_4_ = 0;
  }
  return info_local._4_4_;
}

Assistant:

int mbedtls_ssl_ciphersuite_uses_ec( const mbedtls_ssl_ciphersuite_t *info )
{
    switch( info->key_exchange )
    {
        case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
        case MBEDTLS_KEY_EXCHANGE_ECDH_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA:
            return( 1 );

        default:
            return( 0 );
    }
}